

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

void Fl::copy_image(uchar *data,int W,int H,int clipboard)

{
  uchar *puVar1;
  Atom local_38;
  Atom property;
  int clipboard_local;
  int H_local;
  int W_local;
  uchar *data_local;
  
  if (((data != (uchar *)0x0) && (0 < W)) && (0 < H)) {
    if (fl_selection_buffer[clipboard] != (char *)0x0) {
      operator_delete__(fl_selection_buffer[clipboard]);
    }
    puVar1 = create_bmp(data,W,H,fl_selection_length + clipboard);
    fl_selection_buffer[clipboard] = (char *)puVar1;
    fl_selection_buffer_length[clipboard] = fl_selection_length[clipboard];
    fl_i_own_selection[clipboard] = '\x01';
    fl_selection_type[clipboard] = "image";
    if (clipboard == 0) {
      local_38 = 1;
    }
    else {
      local_38 = CLIPBOARD;
    }
    XSetSelectionOwner(fl_display,local_38,fl_message_window,fl_event_time);
  }
  return;
}

Assistant:

void Fl::copy_image(const unsigned char *data, int W, int H, int clipboard){
  if(!data || W<=0 || H<=0) return;
  delete[] fl_selection_buffer[clipboard];
  fl_selection_buffer[clipboard] = (char *) create_bmp(data,W,H,&fl_selection_length[clipboard]);
  fl_selection_buffer_length[clipboard] = fl_selection_length[clipboard];
  fl_i_own_selection[clipboard] = 1;
  fl_selection_type[clipboard] = Fl::clipboard_image;

  Atom property = clipboard ? CLIPBOARD : XA_PRIMARY;
  XSetSelectionOwner(fl_display, property, fl_message_window, fl_event_time);
}